

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O2

int Kf_SetLoadCuts(Kf_Cut_t *pCuts,int *pIntCuts)

{
  Kf_Cut_t *pKVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  uint *puVar8;
  
  puVar8 = (uint *)(pIntCuts + 2);
  piVar6 = pCuts->pLeaves;
  lVar5 = 0;
  do {
    if (*pIntCuts <= lVar5) {
      return (int)lVar5;
    }
    pCuts[lVar5].Sign = 0;
    pCuts[lVar5].Polar = 0;
    pKVar1 = pCuts + lVar5;
    pCuts[lVar5].iFunc = puVar8[(long)(int)*puVar8 + 1];
    pCuts[lVar5].Delay = puVar8[(long)(int)*puVar8 + 2];
    uVar2 = *puVar8;
    uVar4 = (ulong)(int)uVar2;
    pCuts[lVar5].Area = (float)puVar8[uVar4 + 3];
    pCuts[lVar5].nLeaves = uVar2;
    for (lVar7 = 0; lVar7 < (int)uVar4; lVar7 = lVar7 + 1) {
      iVar3 = Abc_Lit2Var(puVar8[lVar7 + 1]);
      piVar6[lVar7] = iVar3;
      pKVar1->Sign = pKVar1->Sign | 1L << ((byte)iVar3 & 0x3f);
      if ((int)puVar8[lVar7 + 1] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf3,"int Abc_LitIsCompl(int)");
      }
      if ((puVar8[lVar7 + 1] & 1) != 0) {
        pKVar1->Polar = pKVar1->Polar | 1 << ((byte)lVar7 & 0x1f);
      }
      uVar4 = (ulong)*puVar8;
    }
    lVar5 = lVar5 + 1;
    puVar8 = puVar8 + (long)(int)uVar4 + 4;
    piVar6 = piVar6 + 0x18;
  } while( true );
}

Assistant:

static inline int Kf_SetLoadCuts( Kf_Cut_t * pCuts, int * pIntCuts )
{
    Kf_Cut_t * pCut;
    int k, * pIntCut, nCuts = 0; 
    Kf_ObjForEachCutInt( pIntCuts, pIntCut, nCuts )
    {
        pCut = pCuts + nCuts;
        pCut->Sign  = 0;
        pCut->Polar = 0;
        pCut->iFunc = pIntCut[pIntCut[0] + 1];
        pCut->Delay = pIntCut[pIntCut[0] + 2];
        pCut->Area  = Abc_Int2Float(pIntCut[pIntCut[0] + 3]);
        pCut->nLeaves = pIntCut[0];    
        for ( k = 0; k < pIntCut[0]; k++ )
        {
            pCut->pLeaves[k] = Abc_Lit2Var(pIntCut[k+1]);
            pCut->Sign |= ((word)1) << (pCut->pLeaves[k] & 0x3F);
            if ( Abc_LitIsCompl(pIntCut[k+1]) )
                pCut->Polar |= (1 << k);
        }
    }
    return nCuts;
}